

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_descriptor_wsh(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  _Bool _Var2;
  int32_t iVar3;
  int iVar4;
  
  iVar4 = -2;
  if ((parent == (miniscript_node_t *)0x0) ||
     ((parent->info != (miniscript_item_t *)0x0 && (parent->info->kind == 0x502)))) {
    iVar3 = get_child_list_count(node);
    if ((iVar3 == node->info->inner_num) &&
       (pmVar1 = node->child, pmVar1->info != (miniscript_item_t *)0x0)) {
      _Var2 = has_uncompressed_key_by_child(node);
      if (!_Var2) {
        node->type_properties = pmVar1->type_properties;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int verify_descriptor_wsh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent && (!parent->info || (parent->info->kind != DESCRIPTOR_KIND_DESCRIPTOR_SH)))
        return WALLY_EINVAL;
    if ((get_child_list_count(node) != node->info->inner_num) || !node->child->info)
        return WALLY_EINVAL;
    if (has_uncompressed_key_by_child(node))
        return WALLY_EINVAL;

    node->type_properties = node->child->type_properties;
    return WALLY_OK;
}